

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

void CVmRun::create_loadctx_obj
               (vm_val_t *result,vm_obj_id_t self,vm_obj_id_t defobj,vm_obj_id_t targobj,
               vm_prop_id_t targprop)

{
  vm_obj_id_t obj;
  vm_val_t *in_RDI;
  char buf [22];
  undefined4 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbc;
  vm_prop_id_t in_stack_ffffffffffffffbe;
  char *in_stack_ffffffffffffffc0;
  
  vmb_put_len(in_stack_ffffffffffffffc0,
              CONCAT26(in_stack_ffffffffffffffbe,
                       CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)));
  vmb_put_dh_obj(in_stack_ffffffffffffffc0,
                 CONCAT22(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc));
  vmb_put_dh_prop(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe);
  vmb_put_dh_obj(in_stack_ffffffffffffffc0,
                 CONCAT22(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc));
  vmb_put_dh_obj(in_stack_ffffffffffffffc0,
                 CONCAT22(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc));
  obj = CVmObjList::create((int)((ulong)in_RDI >> 0x20),
                           (char *)CONCAT26(in_stack_ffffffffffffffbe,
                                            CONCAT24(in_stack_ffffffffffffffbc,
                                                     in_stack_ffffffffffffffb8)));
  vm_val_t::set_obj(in_RDI,obj);
  return;
}

Assistant:

void CVmRun::create_loadctx_obj(VMG_ vm_val_t *result,
                                vm_obj_id_t self,
                                vm_obj_id_t defobj,
                                vm_obj_id_t targobj,
                                vm_prop_id_t targprop)
{
    char buf[VMB_LEN + 4*VMB_DATAHOLDER];
    
    /* initialize a list template for a four-element list */
    vmb_put_len(buf, 4);
    
    /* 
     *   put the list elements: 'self', targetprop, original target object,
     *   and defining object 
     */
    vmb_put_dh_obj(buf + VMB_LEN, self);
    vmb_put_dh_prop(buf + VMB_LEN + VMB_DATAHOLDER, targprop);
    vmb_put_dh_obj(buf + VMB_LEN + 2*VMB_DATAHOLDER, targobj);
    vmb_put_dh_obj(buf + VMB_LEN + 3*VMB_DATAHOLDER, defobj);
    
    /* create and return a new list copied from our prepared buffer */
    result->set_obj(CVmObjList::create(vmg_ FALSE, buf));
}